

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

void Bmc_MnaFree(Bmc_Mna_t *p)

{
  Cnf_DataFree(p->pCnf);
  Vec_IntFreeP(&p->vPiMap);
  Vec_IntFreeP(&p->vId2Var);
  Vec_IntFreeP(&p->vInputs);
  Vec_IntFreeP(&p->vOutputs);
  Vec_IntFreeP(&p->vNodes);
  sat_solver_delete(p->pSat);
  free(p);
  return;
}

Assistant:

void Bmc_MnaFree( Bmc_Mna_t * p )
{
    Cnf_DataFree( p->pCnf );
    Vec_IntFreeP( &p->vPiMap );
    Vec_IntFreeP( &p->vId2Var );
    Vec_IntFreeP( &p->vInputs );
    Vec_IntFreeP( &p->vOutputs );
    Vec_IntFreeP( &p->vNodes );
    sat_solver_delete( p->pSat );
    ABC_FREE( p );
}